

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcwrite.c
# Opt level: O3

void bcwrite_proto(BCWriteCtx *ctx,GCproto *pt)

{
  double dVar1;
  char cVar2;
  uint64_t uVar3;
  GCproto *pt_00;
  char *pcVar4;
  long lVar5;
  uint uVar6;
  MSize i;
  uint uVar7;
  uint32_t uVar8;
  MSize MVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long *plVar16;
  ulong uVar17;
  cTValue *pcVar18;
  
  if (((pt->flags & 1) != 0) && (uVar13 = pt->sizekgc, (ulong)uVar13 != 0)) {
    uVar3 = (pt->k).ptr64;
    lVar14 = 0;
    do {
      pt_00 = *(GCproto **)((uVar3 - 8) + lVar14 * 8);
      if (pt_00->gct == '\a') {
        bcwrite_proto(ctx,pt_00);
      }
      lVar14 = lVar14 + -1;
    } while (-lVar14 != (ulong)uVar13);
  }
  MVar9 = (uint)pt->sizeuv * 2 + pt->sizebc * 4 + 0x23;
  pcVar4 = (ctx->sb).b;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < MVar9) {
    pcVar4 = lj_buf_need2(&ctx->sb,MVar9);
  }
  pcVar4[5] = pt->flags & 7;
  pcVar4[6] = pt->numparams;
  pcVar4[7] = pt->framesize;
  pcVar4[8] = pt->sizeuv;
  pcVar4 = lj_strfmt_wuleb128(pcVar4 + 9,pt->sizekgc);
  pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->sizekn);
  pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->sizebc - 1);
  if (ctx->strip == 0) {
    uVar3 = (pt->lineinfo).ptr64;
    if (uVar3 == 0) {
      uVar13 = 0;
      uVar8 = 0;
    }
    else {
      iVar10 = (int)pt - (int)uVar3;
      MVar9 = pt->sizept;
      pcVar4 = lj_strfmt_wuleb128(pcVar4,iVar10 + MVar9);
      uVar13 = iVar10 + MVar9;
      if (uVar13 == 0) goto LAB_0012c5d6;
      pcVar4 = lj_strfmt_wuleb128(pcVar4,pt->firstline);
      uVar8 = pt->numline;
    }
    pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar8);
  }
  else {
LAB_0012c5d6:
    uVar13 = 0;
  }
  MVar9 = pt->sizebc;
  uVar17 = (ulong)(MVar9 * 4 - 4);
  memcpy(pcVar4,(void *)((long)&pt[1].nextgc.gcptr64 + 4),uVar17);
  if ((pt->flags & 0x10) == 0) {
    if (MVar9 == 1 || pt->trace == 0) goto LAB_0012c6d6;
  }
  else if (MVar9 == 1) goto LAB_0012c6d6;
  lVar14 = *(long *)(((ctx->sb).L.ptr64 & 0xfffffffffffffff8) + 0x10);
  lVar5 = 0;
  do {
    uVar11 = (byte)pcVar4[lVar5 * 4] - 0x4e;
    if (uVar11 < 10) {
      if ((0x125U >> (uVar11 & 0x1f) & 1) == 0) {
        if ((0x248U >> (uVar11 & 0x1f) & 1) != 0) {
          *(undefined4 *)(pcVar4 + lVar5 * 4) =
               *(undefined4 *)
                (*(long *)(*(long *)(lVar14 + 0x460) +
                          (ulong)*(ushort *)(pcVar4 + lVar5 * 4 + 2) * 8) + 0x50);
        }
      }
      else {
        pcVar4[lVar5 * 4] = pcVar4[lVar5 * 4] - 1;
      }
    }
    lVar5 = lVar5 + 1;
  } while (MVar9 - 1 != (int)lVar5);
LAB_0012c6d6:
  uVar15 = (ulong)((uint)pt->sizeuv * 2);
  memcpy(pcVar4 + uVar17,(void *)(pt->uv).ptr64,uVar15);
  pcVar4 = pcVar4 + uVar17 + uVar15;
  (ctx->sb).w = pcVar4;
  uVar11 = pt->sizekgc;
  if ((ulong)uVar11 != 0) {
    plVar16 = (long *)((pt->k).ptr64 + (ulong)uVar11 * -8);
    uVar6 = 0;
    do {
      lVar14 = *plVar16;
      cVar2 = *(char *)(lVar14 + 9);
      if (cVar2 == '\n') {
        MVar9 = 0x15;
        if (*(short *)(lVar14 + 10) == 0xb) {
          uVar7 = 2;
        }
        else if (*(short *)(lVar14 + 10) == 0xc) {
          uVar7 = 3;
        }
        else {
          uVar7 = 4;
        }
      }
      else {
        uVar7 = 0;
        MVar9 = 1;
        if (cVar2 != '\a') {
          if (cVar2 == '\x04') {
            uVar7 = *(int *)(lVar14 + 0x14) + 5;
            MVar9 = uVar7;
          }
          else {
            MVar9 = 0xb;
            uVar7 = 1;
          }
        }
      }
      pcVar4 = (ctx->sb).w;
      if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < MVar9) {
        pcVar4 = lj_buf_more2(&ctx->sb,MVar9);
      }
      pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar7);
      if (uVar7 < 5) {
        if (uVar7 == 0) goto LAB_0012c847;
        if (uVar7 != 1) {
          pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar14 + 0x10));
          pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar14 + 0x14));
          if (uVar7 == 4) {
            pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar14 + 0x18));
            pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(lVar14 + 0x1c));
          }
          goto LAB_0012c847;
        }
        uVar8 = 0;
        uVar17 = 0;
        if ((ulong)*(uint *)(lVar14 + 0x30) != 0) {
          uVar15 = (ulong)*(uint *)(lVar14 + 0x30);
          do {
            uVar17 = uVar15;
            if ((long)uVar17 < 1) {
              uVar17 = 0;
              break;
            }
            uVar15 = uVar17 - 1;
          } while (*(long *)(*(long *)(lVar14 + 0x10) + -8 + uVar17 * 8) == -1);
        }
        iVar10 = *(int *)(lVar14 + 0x34);
        if (iVar10 != 0) {
          lVar5 = 0;
          uVar8 = 0;
          do {
            uVar8 = uVar8 + (*(long *)(*(long *)(lVar14 + 0x28) + lVar5) != -1);
            lVar5 = lVar5 + 0x18;
          } while ((ulong)(iVar10 + 1 + (uint)(iVar10 == -1)) * 0x18 != lVar5);
        }
        pcVar4 = lj_strfmt_wuleb128(pcVar4,(uint32_t)uVar17);
        pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar8);
        (ctx->sb).w = pcVar4;
        if ((uint32_t)uVar17 != 0) {
          pcVar18 = *(cTValue **)(lVar14 + 0x10);
          do {
            bcwrite_ktabk(ctx,pcVar18,1);
            pcVar18 = pcVar18 + 1;
            uVar7 = (int)uVar17 - 1;
            uVar17 = (ulong)uVar7;
          } while (uVar7 != 0);
        }
        if (uVar8 != 0) {
          pcVar18 = (cTValue *)((ulong)*(uint *)(lVar14 + 0x34) * 0x18 + *(long *)(lVar14 + 0x28));
          do {
            if (pcVar18->u64 != 0xffffffffffffffff) {
              bcwrite_ktabk(ctx,pcVar18 + 1,0);
              bcwrite_ktabk(ctx,pcVar18,1);
              uVar8 = uVar8 - 1;
              if (uVar8 == 0) break;
            }
            pcVar18 = pcVar18 + -3;
          } while( true );
        }
      }
      else {
        uVar7 = *(uint *)(lVar14 + 0x14);
        memcpy(pcVar4,(void *)(lVar14 + 0x18),(ulong)uVar7);
        pcVar4 = pcVar4 + uVar7;
LAB_0012c847:
        (ctx->sb).w = pcVar4;
      }
      uVar6 = uVar6 + 1;
      plVar16 = plVar16 + 1;
    } while (uVar6 != uVar11);
    pcVar4 = (ctx->sb).w;
  }
  uVar3 = (pt->k).ptr64;
  MVar9 = pt->sizekn;
  if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < MVar9 * 10) {
    pcVar4 = lj_buf_more2(&ctx->sb,MVar9 * 10);
  }
  if (MVar9 != 0) {
    lVar14 = 0;
    do {
      dVar1 = *(double *)(uVar3 + lVar14 * 8);
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1))) {
        pcVar4 = lj_strfmt_wuleb128(pcVar4,(SUB84(dVar1,0) & 0x80000000 | SUB84(dVar1,0) * 2) + 1);
        iVar10 = *(int *)(uVar3 + lVar14 * 8);
        if (iVar10 < 0) {
          pcVar4[-1] = (byte)((uint)iVar10 >> 0x1b) & 0x18 | pcVar4[-1] & 7U;
        }
        pcVar4 = lj_strfmt_wuleb128(pcVar4,*(uint32_t *)(uVar3 + 4 + lVar14 * 8));
      }
      else {
        uVar11 = (uint)dVar1;
        pcVar4 = lj_strfmt_wuleb128(pcVar4,uVar11 & 0x80000000 | uVar11 * 2);
        if ((int)uVar11 < 0) {
          pcVar4[-1] = (byte)(uVar11 >> 0x1b) & 0x18 | pcVar4[-1] & 7U;
        }
      }
      lVar14 = lVar14 + 1;
    } while (MVar9 != (MSize)lVar14);
  }
  (ctx->sb).w = pcVar4;
  if (uVar13 != 0) {
    if ((uint)(*(int *)&(ctx->sb).e - (int)pcVar4) < uVar13) {
      pcVar4 = lj_buf_more2(&ctx->sb,uVar13);
    }
    memcpy(pcVar4,(void *)(pt->lineinfo).ptr64,(ulong)uVar13);
    pcVar4 = pcVar4 + uVar13;
    (ctx->sb).w = pcVar4;
  }
  if (ctx->status == 0) {
    pcVar12 = (ctx->sb).b;
    iVar10 = (int)pcVar4 - (int)pcVar12;
    uVar13 = iVar10 - 5;
    uVar11 = 0x1f;
    if (uVar13 != 0) {
      for (; uVar13 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    pcVar12 = pcVar12 + (5 - ((uVar11 ^ 0xffffffe0) * 9 + 0x168 >> 6));
    lj_strfmt_wuleb128(pcVar12,uVar13);
    iVar10 = (*ctx->wfunc)((lua_State *)((ctx->sb).L.ptr64 & 0xfffffffffffffff8),pcVar12,
                           (long)iVar10 + 0xfffffffb,ctx->wdata);
    ctx->status = iVar10;
  }
  return;
}

Assistant:

static void bcwrite_proto(BCWriteCtx *ctx, GCproto *pt)
{
  MSize sizedbg = 0;
  char *p;

  /* Recursively write children of prototype. */
  if ((pt->flags & PROTO_CHILD)) {
    ptrdiff_t i, n = pt->sizekgc;
    GCRef *kr = mref(pt->k, GCRef) - 1;
    for (i = 0; i < n; i++, kr--) {
      GCobj *o = gcref(*kr);
      if (o->gch.gct == ~LJ_TPROTO)
	bcwrite_proto(ctx, gco2pt(o));
    }
  }

  /* Start writing the prototype info to a buffer. */
  p = lj_buf_need(&ctx->sb,
		  5+4+6*5+(pt->sizebc-1)*(MSize)sizeof(BCIns)+pt->sizeuv*2);
  p += 5;  /* Leave room for final size. */

  /* Write prototype header. */
  *p++ = (pt->flags & (PROTO_CHILD|PROTO_VARARG|PROTO_FFI));
  *p++ = pt->numparams;
  *p++ = pt->framesize;
  *p++ = pt->sizeuv;
  p = lj_strfmt_wuleb128(p, pt->sizekgc);
  p = lj_strfmt_wuleb128(p, pt->sizekn);
  p = lj_strfmt_wuleb128(p, pt->sizebc-1);
  if (!ctx->strip) {
    if (proto_lineinfo(pt))
      sizedbg = pt->sizept - (MSize)((char *)proto_lineinfo(pt) - (char *)pt);
    p = lj_strfmt_wuleb128(p, sizedbg);
    if (sizedbg) {
      p = lj_strfmt_wuleb128(p, pt->firstline);
      p = lj_strfmt_wuleb128(p, pt->numline);
    }
  }

  /* Write bytecode instructions and upvalue refs. */
  p = bcwrite_bytecode(ctx, p, pt);
  p = lj_buf_wmem(p, proto_uv(pt), pt->sizeuv*2);
  ctx->sb.w = p;

  /* Write constants. */
  bcwrite_kgc(ctx, pt);
  bcwrite_knum(ctx, pt);

  /* Write debug info, if not stripped. */
  if (sizedbg) {
    p = lj_buf_more(&ctx->sb, sizedbg);
    p = lj_buf_wmem(p, proto_lineinfo(pt), sizedbg);
    ctx->sb.w = p;
  }

  /* Pass buffer to writer function. */
  if (ctx->status == 0) {
    MSize n = sbuflen(&ctx->sb) - 5;
    MSize nn = (lj_fls(n)+8)*9 >> 6;
    char *q = ctx->sb.b + (5 - nn);
    p = lj_strfmt_wuleb128(q, n);  /* Fill in final size. */
    lj_assertBCW(p == ctx->sb.b + 5, "bad ULEB128 write");
    ctx->status = ctx->wfunc(sbufL(&ctx->sb), q, nn+n, ctx->wdata);
  }
}